

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrinsic_geometry_interface.cpp
# Opt level: O1

void __thiscall
geometrycentral::surface::IntrinsicGeometryInterface::computeVertexGaussianCurvatures
          (IntrinsicGeometryInterface *this)

{
  SurfaceMesh *pSVar1;
  double dVar2;
  pointer puVar3;
  long lVar4;
  bool bVar5;
  size_t i;
  double dVar6;
  double dVar7;
  Vertex v;
  MeshData<geometrycentral::surface::Vertex,_double> local_68;
  
  if ((this->vertexAngleSumsQ).super_DependentQuantity.computed == false) {
    if ((this->vertexAngleSumsQ).super_DependentQuantity.evaluateFunc.super__Function_base.
        _M_manager == (_Manager_type)0x0) {
      ::std::__throw_bad_function_call();
    }
    (*(this->vertexAngleSumsQ).super_DependentQuantity.evaluateFunc._M_invoker)
              ((_Any_data *)&(this->vertexAngleSumsQ).super_DependentQuantity.evaluateFunc);
    (this->vertexAngleSumsQ).super_DependentQuantity.computed = true;
  }
  MeshData<geometrycentral::surface::Vertex,_double>::MeshData
            (&local_68,(this->super_BaseGeometryInterface).mesh,0.0);
  MeshData<geometrycentral::surface::Vertex,_double>::operator=
            (&this->vertexGaussianCurvatures,&local_68);
  MeshData<geometrycentral::surface::Vertex,_double>::~MeshData(&local_68);
  pSVar1 = (this->super_BaseGeometryInterface).mesh;
  dVar2 = (double)pSVar1->nVerticesFillCount;
  if ((dVar2 == 0.0) ||
     (puVar3 = (pSVar1->vHalfedgeArr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start, *puVar3 != 0xffffffffffffffff)) {
    dVar6 = 0.0;
  }
  else {
    dVar7 = 0.0;
    do {
      dVar6 = dVar2;
      if ((double)((long)dVar2 - 1U) == dVar7) break;
      dVar6 = (double)((long)dVar7 + 1);
      lVar4 = (long)dVar7 + 1;
      dVar7 = dVar6;
    } while (puVar3[lVar4] == 0xffffffffffffffff);
  }
  if (dVar6 != dVar2) {
    do {
      local_68.mesh = pSVar1;
      local_68.defaultValue = dVar6;
      bVar5 = Vertex::isBoundary((Vertex *)&local_68);
      dVar7 = dVar6;
      if (!bVar5) {
        (this->vertexGaussianCurvatures).data.
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
        [(long)local_68.defaultValue] =
             6.283185307179586 -
             (this->vertexAngleSums).data.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
             [(long)local_68.defaultValue];
      }
      do {
        dVar6 = dVar2;
        if ((double)((long)dVar2 - 1U) == dVar7) break;
        dVar6 = (double)((long)dVar7 + 1);
        lVar4 = (long)dVar7 + 1;
        dVar7 = dVar6;
      } while ((pSVar1->vHalfedgeArr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[lVar4] == 0xffffffffffffffff);
    } while (dVar6 != dVar2);
  }
  return;
}

Assistant:

void IntrinsicGeometryInterface::computeVertexGaussianCurvatures() {
  vertexAngleSumsQ.ensureHave();

  vertexGaussianCurvatures = VertexData<double>(mesh, 0);

  for (Vertex v : mesh.vertices()) {
    if (!v.isBoundary()) {
      vertexGaussianCurvatures[v] = 2. * PI - vertexAngleSums[v];
    }
  }
}